

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_HVC(DisasContext_conflict1 *s,arg_HVC *a)

{
  int iVar1;
  arg_HVC *a_local;
  DisasContext_conflict1 *s_local;
  
  iVar1 = arm_dc_feature(s,5);
  if ((iVar1 != 0) && (iVar1 = arm_dc_feature(s,9), iVar1 == 0)) {
    if (s->user == 0) {
      gen_hvc(s,a->imm);
    }
    else {
      unallocated_encoding_aarch64(s);
    }
    return true;
  }
  return false;
}

Assistant:

static bool trans_HVC(DisasContext *s, arg_HVC *a)
{
    if (!ENABLE_ARCH_7 || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (IS_USER(s)) {
        unallocated_encoding(s);
    } else {
        gen_hvc(s, a->imm);
    }
    return true;
}